

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
libtorrent::lsplit_path
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,libtorrent *this,string_view p)

{
  libtorrent *plVar1;
  void *pvVar2;
  libtorrent *plVar3;
  size_type __n;
  char *__s;
  
  __s = (char *)p._M_len;
  if (this == (libtorrent *)0x0) {
    (__return_storage_ptr__->first)._M_len = 0;
    (__return_storage_ptr__->first)._M_str = (char *)0x0;
    (__return_storage_ptr__->second)._M_len = 0;
    (__return_storage_ptr__->second)._M_str = (char *)0x0;
    return __return_storage_ptr__;
  }
  if (*__s == '/') {
    __s = __s + 1;
    this = this + -1;
    if (this == (libtorrent *)0x0) {
      this = (libtorrent *)0x0;
      goto LAB_00238cd5;
    }
  }
  pvVar2 = memchr(__s,0x2f,(size_t)this);
  plVar3 = (libtorrent *)((long)pvVar2 - (long)__s);
  if (pvVar2 != (void *)0x0 && plVar3 != (libtorrent *)0xffffffffffffffff) {
    plVar1 = plVar3 + 1;
    if (plVar3 < this) {
      (__return_storage_ptr__->first)._M_len = (size_t)plVar3;
      (__return_storage_ptr__->first)._M_str = __s;
      (__return_storage_ptr__->second)._M_len = (long)this - (long)plVar1;
      (__return_storage_ptr__->second)._M_str = (char *)(plVar1 + (long)__s);
      return __return_storage_ptr__;
    }
    ::std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",plVar1
               ,this);
  }
LAB_00238cd5:
  (__return_storage_ptr__->second)._M_len = 0;
  (__return_storage_ptr__->second)._M_str = (char *)0x0;
  (__return_storage_ptr__->first)._M_len = (size_t)this;
  (__return_storage_ptr__->first)._M_str = __s;
  return __return_storage_ptr__;
}

Assistant:

std::pair<string_view, string_view> lsplit_path(string_view p)
	{
		if (p.empty()) return {{}, {}};
		// for absolute paths, skip the initial "/"
		if (p.front() == TORRENT_SEPARATOR_CHAR) p.remove_prefix(1);
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
		else if (p.front() == '/') p.remove_prefix(1);
#endif
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
		auto const sep = p.find_first_of("/\\");
#else
		auto const sep = p.find_first_of(TORRENT_SEPARATOR_CHAR);
#endif
		if (sep == string_view::npos) return {p, {}};
		return { p.substr(0, sep), p.substr(sep + 1) };
	}